

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int open_config(AP_CTX *ctx)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  FILE *pFVar4;
  int *piVar5;
  char *pcVar6;
  
  pFVar4 = fopen(ctx->config_path,"rt");
  ctx->config_file = (FILE *)pFVar4;
  iVar3 = 0;
  if (pFVar4 == (FILE *)0x0) {
    pcVar1 = ctx->config_path;
    pcVar2 = ctx->client_ip;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not open configuration file \'%s\', error: \'%s\'\n",pcVar2,
           pcVar1,pcVar6);
    iVar3 = 9;
  }
  return iVar3;
}

Assistant:

static int open_config (AP_CTX *ctx)
{
	int		rc			= AP_NO_ERROR;
	
	ctx->config_file = fopen (ctx->config_path, "rt");
	if (ctx->config_file == NULL)
	{
		ap_error ("(%s) Can not open configuration file '%s', error: '%s'\n", ctx->client_ip, ctx->config_path, strerror (errno));
		rc = AP_ERROR_CONFIG_FILE;

		goto finish;
	}

finish:
	return rc;
}